

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

void __thiscall IfNeuron::prepareNextState(IfNeuron *this)

{
  double dVar1;
  bool bVar2;
  EVP_PKEY_CTX *in_RSI;
  double *pdVar3;
  
  DifferentialEquation::prepareNextState(&this->ifneuronMembrane);
  bVar2 = (this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
          stochNextStateIsPrepared;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextStateIsPrepared = bVar2;
  dVar1 = (this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.stochNextValue;
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextValue = dVar1;
  if (bVar2 == true) {
    if ((this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue == true) {
      pdVar3 = &(this->ifneuronMembrane).super_StochasticVariable.super_StochasticProcess.
                stochNextValue;
      DifferentialEquation::init(&this->ifneuronMembrane,in_RSI);
      bVar2 = false;
    }
    else {
      if (dVar1 < this->ifneuronTheta || dVar1 == this->ifneuronTheta) {
        return;
      }
      pdVar3 = &this->ifneuronSpikeHeight;
      bVar2 = true;
    }
    (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
    super_StochasticProcess.stochNextValue = *pdVar3;
    (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = bVar2;
  }
  return;
}

Assistant:

void IfNeuron::prepareNextState()
{
	// create next value of differential equation
	ifneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = ifneuronMembrane.isNextStatePrepared();
	stochNextValue = ifneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (eventNextValue) {
			ifneuronMembrane.init();
			stochNextValue = ifneuronMembrane.getNextValue();
			eventNextValue = false;
		} else {
			if (stochNextValue>ifneuronTheta) {
				stochNextValue = ifneuronSpikeHeight;
				eventNextValue = true;
			}
		}
	}
}